

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderObjdump *this,Index segment_index,Index func_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined1 local_30 [8];
  string_view name;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderObjdump *this_local;
  
  name._M_str._0_4_ = func_index;
  name._M_str._4_4_ = segment_index;
  PrintDetails(this,"  - elem[%lu] = func[%u]",this->elem_offset_ + (ulong)this->elem_index_,
               (ulong)func_index);
  _local_30 = BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,(Index)name._M_str);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  if (!bVar1) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    PrintDetails(this," <%.*s>",sVar2 & 0xffffffff,pvVar3);
  }
  PrintDetails(this,"\n");
  this->elem_index_ = this->elem_index_ + 1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                          Index func_index) {
  PrintDetails("  - elem[%" PRIu64 "] = func[%" PRIindex "]",
               elem_offset_ + elem_index_, func_index);
  auto name = GetFunctionName(func_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  elem_index_++;
  return Result::Ok;
}